

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

bool tchecker::system::is_deterministic(system_t *system)

{
  const_iterator_t __first;
  bool bVar1;
  loc_id_t loc;
  event_id_t eVar2;
  integer_iterator_t<unsigned_int> *piVar3;
  difference_type dVar4;
  size_t num_bits;
  const_iterator_t *pcVar5;
  element_type *this;
  edges_collection_const_iterator_t *peVar6;
  element_type *peVar7;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar8;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar9;
  reference rVar10;
  reference local_128;
  uint local_114;
  reference local_110;
  undefined1 local_100 [8];
  edge_const_shared_ptr_t e;
  edges_collection_const_iterator_t __end3;
  edges_collection_const_iterator_t __begin3;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *__range3;
  loc_const_shared_ptr_t l;
  const_iterator_t __end2_1;
  const_iterator_t __begin2_1;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  *__range2_1;
  allocator<unsigned_long> local_79;
  undefined1 local_78 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> outevents;
  undefined1 local_48 [8];
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  initial_locations;
  integer_iterator_t<unsigned_int> local_30;
  process_id_t pid;
  integer_iterator_t<unsigned_int> __end2;
  integer_iterator_t<unsigned_int> __begin2;
  processes_identifiers_range_t *__range2;
  system_t *system_local;
  
  ___end2 = processes_t::processes_identifiers(&system->super_processes_t);
  piVar3 = range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
           ::begin((range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
                    *)&__end2);
  pid = piVar3->_current;
  piVar3 = range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
           ::end((range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
                  *)&__end2);
  local_30._current = piVar3->_current;
  while( true ) {
    bVar1 = integer_iterator_t<unsigned_int>::operator!=
                      ((integer_iterator_t<unsigned_int> *)&pid,&local_30);
    if (!bVar1) break;
    initial_locations._end.super_const_iterator._M_current._4_4_ =
         integer_iterator_t<unsigned_int>::operator*((integer_iterator_t<unsigned_int> *)&pid);
    _local_48 = locs_t::initial_locations
                          (&system->super_locs_t,
                           initial_locations._end.super_const_iterator._M_current._4_4_);
    pcVar5 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
             ::begin((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                      *)local_48);
    __first.super_const_iterator._M_current =
         (const_iterator)(pcVar5->super_const_iterator)._M_current;
    pcVar5 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
             ::end((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                    *)local_48);
    outevents.m_num_bits = (size_type)(pcVar5->super_const_iterator)._M_current;
    dVar4 = std::distance<tchecker::system::locs_t::const_iterator_t>
                      (__first,(const_iterator_t)outevents.m_num_bits);
    if (1 < dVar4) {
      system_local._7_1_ = 0;
      goto LAB_00199d0f;
    }
    integer_iterator_t<unsigned_int>::operator++((integer_iterator_t<unsigned_int> *)&pid);
  }
  num_bits = events_t::events_count(&system->super_events_t);
  std::allocator<unsigned_long>::allocator(&local_79);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,num_bits,0,
             &local_79);
  std::allocator<unsigned_long>::~allocator(&local_79);
  rVar8 = locs_t::locations(&system->super_locs_t);
  __begin2_1 = rVar8._begin.super_const_iterator._M_current;
  pcVar5 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::begin((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                    *)&__begin2_1);
  __end2_1.super_const_iterator._M_current =
       (const_iterator)(pcVar5->super_const_iterator)._M_current;
  pcVar5 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::end((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                  *)&__begin2_1);
  l.super___shared_ptr<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pcVar5->super_const_iterator)._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1.super_const_iterator,
                       (__normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
                        *)&l.
                           super___shared_ptr<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    if (!bVar1) break;
    locs_t::const_iterator_t::operator*((const_iterator_t *)&__range3);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
    this = std::
           __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&__range3);
    loc = loc_t::id(this);
    rVar9 = edges_t::outgoing_edges(&system->super_edges_t,loc);
    __begin3 = rVar9._begin.super_const_iterator._M_current;
    peVar6 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
             ::begin((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                      *)&__begin3);
    __end3.super_const_iterator._M_current =
         (const_iterator)(peVar6->super_const_iterator)._M_current;
    peVar6 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
             ::end((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                    *)&__begin3);
    e.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (peVar6->super_const_iterator)._M_current;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3.super_const_iterator,
                         (__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                          *)&e.
                             super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
      if (!bVar1) break;
      edges_collection_const_iterator_t::operator*((edges_collection_const_iterator_t *)local_100);
      peVar7 = std::
               __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_100);
      eVar2 = edge_t::event_id(peVar7);
      rVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
                          (ulong)eVar2);
      local_110 = rVar10;
      bVar1 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_110);
      if (bVar1) {
        system_local._7_1_ = 0;
      }
      else {
        peVar7 = std::
                 __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_100);
        eVar2 = edge_t::event_id(peVar7);
        rVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                            local_78,(ulong)eVar2);
        local_128 = rVar10;
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
                  (&local_128,true);
      }
      local_114 = (uint)bVar1;
      std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
                ((shared_ptr<const_tchecker::system::edge_t> *)local_100);
      if (local_114 != 0) goto LAB_00199cb2;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
      ::operator++(&__end3.super_const_iterator);
    }
    local_114 = 0;
LAB_00199cb2:
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)&__range3);
    if (local_114 != 0) goto LAB_00199cf9;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
    ::operator++(&__end2_1.super_const_iterator);
  }
  system_local._7_1_ = 1;
  local_114 = 1;
LAB_00199cf9:
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
LAB_00199d0f:
  return (bool)(system_local._7_1_ & 1);
}

Assistant:

bool is_deterministic(tchecker::system::system_t const & system)
{
  // Check that each process has only one initial location
  for (tchecker::process_id_t const pid : system.processes_identifiers()) {
    auto initial_locations = system.initial_locations(pid);
    if (std::distance(initial_locations.begin(), initial_locations.end()) > 1)
      return false;
  }

  // Check that every location has at most one outgoing edge for each event
  boost::dynamic_bitset<> outevents(system.events_count(), 0);
  for (tchecker::system::loc_const_shared_ptr_t l : system.locations()) {
    outevents.reset();
    for (tchecker::system::edge_const_shared_ptr_t e : system.outgoing_edges(l->id())) {
      if (outevents[e->event_id()])
        return false;
      outevents[e->event_id()] = 1;
    }
  }
  return true;
}